

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

DBKeyID __thiscall
anon_unknown.dwarf_138c18::SQLiteBuildDB::getKeyIDFromDB
          (SQLiteBuildDB *this,KeyID keyID,string *error_out)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint64_t uVar5;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined4 local_7c;
  string local_78;
  ValueTy local_58;
  undefined1 local_50 [8];
  KeyType key;
  int result;
  string *error_out_local;
  SQLiteBuildDB *this_local;
  KeyID keyID_local;
  
  local_58 = keyID._value;
  (*this->delegate->_vptr_BuildDBDelegate[3])(local_50,this->delegate,keyID._value);
  key.key.field_2._12_4_ = sqlite3_reset(this->findKeyIDForKeyStmt);
  if (key.key.field_2._12_4_ == 0) {
    key.key.field_2._12_4_ = sqlite3_clear_bindings(this->findKeyIDForKeyStmt);
    if (key.key.field_2._12_4_ == 0) {
      psVar1 = this->findKeyIDForKeyStmt;
      pcVar3 = llbuild::core::KeyType::data((KeyType *)local_50);
      sVar4 = llbuild::core::KeyType::size((KeyType *)local_50);
      key.key.field_2._12_4_ = sqlite3_bind_text(psVar1,1,pcVar3,sVar4 & 0xffffffff,0);
      if (key.key.field_2._12_4_ == 0) {
        key.key.field_2._12_4_ = sqlite3_step(this->findKeyIDForKeyStmt);
        if (key.key.field_2._12_4_ == 100) {
          iVar2 = sqlite3_column_count(this->findKeyIDForKeyStmt);
          if (iVar2 != 1) {
            __assert_fail("sqlite3_column_count(findKeyIDForKeyStmt) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x398,
                          "DBKeyID (anonymous namespace)::SQLiteBuildDB::getKeyIDFromDB(KeyID, std::string *)"
                         );
          }
          uVar5 = sqlite3_column_int64(this->findKeyIDForKeyStmt,0);
          DBKeyID::DBKeyID((DBKeyID *)&keyID_local,uVar5);
        }
        else {
          key.key.field_2._12_4_ = sqlite3_reset(this->insertIntoKeysStmt);
          if (key.key.field_2._12_4_ == 0) {
            key.key.field_2._12_4_ = sqlite3_clear_bindings(this->insertIntoKeysStmt);
            if (key.key.field_2._12_4_ == 0) {
              psVar1 = this->insertIntoKeysStmt;
              pcVar3 = llbuild::core::KeyType::data((KeyType *)local_50);
              sVar4 = llbuild::core::KeyType::size((KeyType *)local_50);
              key.key.field_2._12_4_ = sqlite3_bind_text(psVar1,1,pcVar3,sVar4 & 0xffffffff,0);
              if (key.key.field_2._12_4_ == 0) {
                key.key.field_2._12_4_ = sqlite3_step(this->insertIntoKeysStmt);
                if (key.key.field_2._12_4_ == 0x65) {
                  uVar5 = sqlite3_last_insert_rowid(this->db);
                  DBKeyID::DBKeyID((DBKeyID *)&keyID_local,uVar5);
                }
                else {
                  (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                            (&local_140,this);
                  std::__cxx11::string::operator=((string *)error_out,(string *)&local_140);
                  std::__cxx11::string::~string((string *)&local_140);
                  DBKeyID::DBKeyID((DBKeyID *)&keyID_local);
                }
              }
              else {
                (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                          (&local_120,this);
                std::__cxx11::string::operator=((string *)error_out,(string *)&local_120);
                std::__cxx11::string::~string((string *)&local_120);
                DBKeyID::DBKeyID((DBKeyID *)&keyID_local);
              }
            }
            else {
              (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                        (&local_100,this);
              std::__cxx11::string::operator=((string *)error_out,(string *)&local_100);
              std::__cxx11::string::~string((string *)&local_100);
              DBKeyID::DBKeyID((DBKeyID *)&keyID_local);
            }
          }
          else {
            (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_e0,this);
            std::__cxx11::string::operator=((string *)error_out,(string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            DBKeyID::DBKeyID((DBKeyID *)&keyID_local);
          }
        }
      }
      else {
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_c0,this);
        std::__cxx11::string::operator=((string *)error_out,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        DBKeyID::DBKeyID((DBKeyID *)&keyID_local);
      }
    }
    else {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_a0,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      DBKeyID::DBKeyID((DBKeyID *)&keyID_local);
    }
  }
  else {
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_78,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    DBKeyID::DBKeyID((DBKeyID *)&keyID_local);
  }
  local_7c = 1;
  llbuild::core::KeyType::~KeyType((KeyType *)local_50);
  return (DBKeyID)keyID_local._value;
}

Assistant:

DBKeyID getKeyIDFromDB(KeyID keyID, std::string *error_out) {
#define checkSQLiteResultOKReturnDBKeyID(result) \
if (result != SQLITE_OK) { \
  *error_out = getCurrentErrorMessage(); \
  return DBKeyID(); \
}

    int result;

    // Search for the key in the key_names table
    auto key = delegate->getKeyForID(keyID);
    result = sqlite3_reset(findKeyIDForKeyStmt);
    checkSQLiteResultOKReturnDBKeyID(result);
    result = sqlite3_clear_bindings(findKeyIDForKeyStmt);
    checkSQLiteResultOKReturnDBKeyID(result);
    result = sqlite3_bind_text(findKeyIDForKeyStmt, /*index=*/1,
                               key.data(), key.size(),
                               SQLITE_STATIC);
    checkSQLiteResultOKReturnDBKeyID(result);

    result = sqlite3_step(findKeyIDForKeyStmt);
    if (result == SQLITE_ROW) {
      assert(sqlite3_column_count(findKeyIDForKeyStmt) == 1);

      // Found a keyID.
      return DBKeyID(sqlite3_column_int64(findKeyIDForKeyStmt, 0));
    }

    // Did not find the key, need to insert.
    result = sqlite3_reset(insertIntoKeysStmt);
    checkSQLiteResultOKReturnDBKeyID(result);
    result = sqlite3_clear_bindings(insertIntoKeysStmt);
    checkSQLiteResultOKReturnDBKeyID(result);
    result = sqlite3_bind_text(insertIntoKeysStmt, /*index=*/1,
                               key.data(), key.size(),
                               SQLITE_STATIC);
    checkSQLiteResultOKReturnDBKeyID(result);
    result = sqlite3_step(insertIntoKeysStmt);
    if (result != SQLITE_DONE) {
      *error_out = getCurrentErrorMessage();
      return DBKeyID();
    }

    return DBKeyID(sqlite3_last_insert_rowid(db));
#undef checkSQLiteResultOKReturnDBKeyID
  }